

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O2

Function * __thiscall
spvtools::opt::InstrumentPass::GetFunction
          (InstrumentPass *this,Type *return_val,
          vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
          *args)

{
  int iVar1;
  TypeManager *this_00;
  Type *pTVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Function func;
  Function FStack_58;
  
  analysis::Function::Function(&FStack_58,return_val,args);
  this_00 = IRContext::get_type_mgr((this->super_Pass).context_);
  pTVar2 = analysis::TypeManager::GetRegisteredType(this_00,&FStack_58.super_Type);
  if (pTVar2 != (Type *)0x0) {
    iVar1 = (*pTVar2->_vptr_Type[0x21])(pTVar2);
    if (CONCAT44(extraout_var,iVar1) != 0) {
      iVar1 = (*pTVar2->_vptr_Type[0x21])(pTVar2);
      analysis::Function::~Function(&FStack_58);
      return (Function *)CONCAT44(extraout_var_00,iVar1);
    }
  }
  __assert_fail("type && type->AsFunction()",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instrument_pass.cpp"
                ,0x1a8,
                "analysis::Function *spvtools::opt::InstrumentPass::GetFunction(const analysis::Type *, const std::vector<const analysis::Type *> &)"
               );
}

Assistant:

analysis::Function* InstrumentPass::GetFunction(
    const analysis::Type* return_val,
    const std::vector<const analysis::Type*>& args) {
  analysis::Function func(return_val, args);
  analysis::Type* type = context()->get_type_mgr()->GetRegisteredType(&func);
  assert(type && type->AsFunction());
  return type->AsFunction();
}